

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall chrono::ChFrameMoving<double>::Invert(ChFrameMoving<double> *this)

{
  ChFrameMoving<double> unit;
  ChFrameMoving<double> tmp;
  ChQuaternion<double> local_258;
  ChVector<double> local_238;
  ChFrameMoving<double> local_218;
  ChFrameMoving<double> local_120;
  
  local_258.m_data[2] = 0.0;
  local_218.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_258.m_data[0] = 0.0;
  local_258.m_data[1] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_218.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving(&local_120,(ChVector<double> *)&local_258,(ChQuaternion<double> *)&local_218);
  local_258.m_data[0] = 1.0;
  local_258.m_data[3] = 0.0;
  local_258.m_data[1] = 0.0;
  local_258.m_data[2] = 0.0;
  local_238.m_data[2] = 0.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  ChFrameMoving(&local_218,&local_238,&local_258);
  operator=(&local_120,this);
  TransformParentToLocal(&local_120,&local_218,this);
  return;
}

Assistant:

virtual void Invert() override {
        ChFrameMoving<Real> tmp;
        ChFrameMoving<Real> unit;
        tmp = *this;
        tmp.TransformParentToLocal(unit, *this);
    }